

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

Object * __thiscall pstack::Elf::Object::getDebug(Object *this)

{
  _Atomic_word *this_00;
  string *psVar1;
  char *__path;
  long lVar2;
  long *plVar3;
  _Base_ptr p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined4 uVar6;
  Reader *this_01;
  bool bVar7;
  int iVar8;
  unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_> *sect;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar9;
  undefined4 extraout_var_01;
  Section *pSVar10;
  Section *pSVar11;
  long *plVar12;
  _Rb_tree_node_base *p_Var13;
  anon_struct_56_8_fb3e104e *sect_1;
  _Base_ptr p_Var14;
  Reader *things;
  Object *pOVar15;
  ulong uVar16;
  Addr diff;
  long lVar17;
  _Alloc_hider local_2b0;
  ostringstream dir;
  undefined1 local_138 [8];
  iterator __end2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> local_e8 [2];
  undefined1 local_c8 [8];
  iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buildID;
  undefined1 local_68 [32];
  Reader *local_48;
  csptr io;
  
  if ((this->debugLoaded != false) || ((this->context->options).noExtDebug == true)) {
    return (this->debugObject).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  }
  this->debugLoaded = true;
  __begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Notes::iterator::iterator((iterator *)local_c8,this,true);
  io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  Notes::iterator::iterator((iterator *)local_138,this,false);
  do {
    bVar7 = Notes::iterator::operator!=((iterator *)local_c8,(iterator *)local_138);
    if (!bVar7) goto LAB_0017478a;
    Notes::iterator::operator*((NoteDesc *)local_68,(iterator *)local_c8);
    (**(code **)(*(long *)local_68._16_8_ + 0x38))
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffd50,local_68._16_8_,0xc);
    bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stack0xfffffffffffffd50,"GNU");
    uVar6 = local_68._8_4_;
    if (bVar7) {
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
      if (uVar6 == 3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffd50);
        std::operator<<((ostream *)&stack0xfffffffffffffd50,".build-id/");
        NoteDesc::data((NoteDesc *)&local_48);
        iVar8 = (*local_48->_vptr_Reader[8])();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &__begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,CONCAT44(extraout_var,iVar8));
        this_01 = local_48;
        _Var5 = __begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
        iVar8 = (*local_48->_vptr_Reader[8])(local_48);
        Reader::readObj<unsigned_char>
                  (this_01,0,(uchar *)_Var5._M_pi,CONCAT44(extraout_var_00,iVar8));
        *(uint *)(&stack0xfffffffffffffd68 + *(long *)(local_2b0._M_p + -0x18)) =
             *(uint *)(&stack0xfffffffffffffd68 + *(long *)(local_2b0._M_p + -0x18)) & 0xffffffb5 |
             8;
        *(undefined8 *)(&stack0xfffffffffffffd60 + *(long *)(local_2b0._M_p + -0x18)) = 2;
        poVar9 = std::operator<<(&stack0xfffffffffffffd50,0x30);
        std::ostream::operator<<
                  (poVar9,(uint)*(byte *)&(__begin2.io.
                                           super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_vptr__Sp_counted_base);
        std::operator<<((ostream *)&stack0xfffffffffffffd50,"/");
        for (uVar16 = 1; iVar8 = (*local_48->_vptr_Reader[8])(),
            uVar16 < CONCAT44(extraout_var_01,iVar8); uVar16 = uVar16 + 1) {
          *(undefined8 *)(&stack0xfffffffffffffd60 + *(long *)(local_2b0._M_p + -0x18)) = 2;
          std::ostream::operator<<
                    (&stack0xfffffffffffffd50,
                     (uint)*(byte *)((long)&(__begin2.io.
                                             super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16));
        }
        poVar9 = std::operator<<((ostream *)&stack0xfffffffffffffd50,".debug");
        *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
             *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
        psVar1 = *(string **)
                  &io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi[5]._M_use_count;
        std::__cxx11::stringbuf::str();
        Context::getDebugImage
                  ((Context *)
                   &__end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,psVar1);
        std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)
                   &io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi[0x14]._M_use_count,
                   (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)
                   &__end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
        std::__cxx11::string::~string((string *)local_e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&io);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffd50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18));
LAB_0017478a:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__end2.io);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__begin2.io);
        _Var5 = io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        this_00 = &io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi[0x14]._M_use_count;
        lVar17._0_4_ = io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[0x14]._M_use_count;
        lVar17._4_4_ = io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[0x14]._M_weak_count;
        if (lVar17 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xfffffffffffffd50,".gnu_debuglink",(allocator<char> *)local_c8
                    );
          pSVar10 = getSection((Object *)
                               io.
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,(string *)&stack0xfffffffffffffd50,1);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
          if ((pSVar10->shdr).sh_type != 0) {
            Section::io((Section *)local_c8);
            (**(code **)(*(long *)local_c8 + 0x38))(&stack0xfffffffffffffd50,local_c8,0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__begin2);
            __path = *(char **)&io.
                                super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi[5]._M_use_count;
            stringify<pstack::Reader_const&>
                      ((string *)local_138,
                       (pstack *)
                       io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[4]._vptr__Sp_counted_base,things);
            Context::dirname((Context *)local_c8,__path);
            std::__cxx11::string::~string((string *)local_138);
            psVar1 = *(string **)
                      &io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[5]._M_use_count;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,"/");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&stack0xfffffffffffffd50);
            Context::getDebugImage((Context *)local_e8,psVar1);
            std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                       local_e8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_e8[0]._M_refcount);
            std::__cxx11::string::~string((string *)local_138);
            std::__cxx11::string::~string((string *)local_68);
            std::__cxx11::string::~string((string *)local_c8);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
          }
          lVar2._0_4_ = _Var5._M_pi[0x14]._M_use_count;
          lVar2._4_4_ = _Var5._M_pi[0x14]._M_weak_count;
          if (lVar2 == 0) {
            if (1 < *(int *)(*(long *)&io.
                                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi[5]._M_use_count + 0xa0)) {
              poVar9 = std::operator<<(*(ostream **)
                                        (*(long *)&io.
                                                  super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi[5]._M_use_count + 0x78),
                                       "no debug object for ");
              (**(code **)(*io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[4]._vptr__Sp_counted_base + 0x28))
                        (io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi[4]._vptr__Sp_counted_base,poVar9);
              std::operator<<(poVar9,"\n");
            }
            pOVar15 = (Object *)0x0;
            goto LAB_00174b51;
          }
        }
        if (1 < *(int *)(*(long *)&io.
                                   super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi[5]._M_use_count + 0xa0)) {
          poVar9 = std::operator<<(*(ostream **)
                                    (*(long *)&io.
                                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi[5]._M_use_count + 0x78),
                                   "found debug object ");
          (**(code **)(**(long **)(*(long *)this_00 + 0x40) + 0x28))
                    (*(long **)(*(long *)this_00 + 0x40),poVar9);
          poVar9 = std::operator<<(poVar9," for ");
          (**(code **)(*io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[4]._vptr__Sp_counted_base + 0x28))
                    (io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi[4]._vptr__Sp_counted_base,poVar9);
          std::operator<<(poVar9,"\n");
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&stack0xfffffffffffffd50,".dynamic",(allocator<char> *)local_c8);
        pSVar10 = getSection((Object *)
                             io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi,(string *)&stack0xfffffffffffffd50,0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
        pOVar15 = *(Object **)this_00;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&stack0xfffffffffffffd50,".dynamic",(allocator<char> *)local_c8);
        pSVar11 = getSection(pOVar15,(string *)&stack0xfffffffffffffd50,0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
        lVar17 = (pSVar10->shdr).sh_addr - (pSVar11->shdr).sh_addr;
        if ((lVar17 != 0) &&
           (plVar12 = *(long **)(*(long *)&io.
                                           super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi[5]._M_use_count + 0x78),
           plVar12 != (long *)0x0)) {
          IOFlagSave::IOFlagSave
                    ((IOFlagSave *)&stack0xfffffffffffffd50,
                     (ios *)((long)plVar12 + *(long *)(*plVar12 + -0x18)));
          poVar9 = std::operator<<(*(ostream **)
                                    (*(long *)&io.
                                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi[5]._M_use_count + 0x78),
                                   "warning: dynamic section for debug symbols ");
          (**(code **)(**(long **)(*(long *)this_00 + 0x40) + 0x28))
                    (*(long **)(*(long *)this_00 + 0x40),poVar9);
          poVar9 = std::operator<<(poVar9," loaded for object ");
          (**(code **)(*io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[4]._vptr__Sp_counted_base + 0x28))
                    (io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi[4]._vptr__Sp_counted_base,poVar9);
          poVar9 = std::operator<<(poVar9," at different offset: diff is ");
          *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
               *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9,", assuming ");
          (**(code **)(*io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[4]._vptr__Sp_counted_base + 0x28))
                    (io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi[4]._vptr__Sp_counted_base,poVar9);
          poVar9 = std::operator<<(poVar9," is prelinked");
          *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
               *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::endl<char,std::char_traits<char>>(poVar9);
          lVar2 = *(long *)this_00;
          plVar3 = *(long **)(lVar2 + 0xc0);
          for (plVar12 = *(long **)(lVar2 + 0xb8); plVar12 != plVar3; plVar12 = plVar12 + 1) {
            *(long *)(*plVar12 + 0x48) = *(long *)(*plVar12 + 0x48) + lVar17;
          }
          for (p_Var13 = *(_Rb_tree_node_base **)(lVar2 + 0x118);
              p_Var13 != (_Rb_tree_node_base *)(lVar2 + 0x108);
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
            p_Var4 = p_Var13[1]._M_left;
            for (p_Var14 = p_Var13[1]._M_parent; p_Var14 != p_Var4;
                p_Var14 = (_Base_ptr)&p_Var14[1]._M_right) {
              p_Var14->_M_left = (_Base_ptr)((long)p_Var14->_M_left + lVar17);
            }
          }
          IOFlagSave::~IOFlagSave((IOFlagSave *)&stack0xfffffffffffffd50);
        }
        pOVar15 = *(Object **)this_00;
LAB_00174b51:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &__begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        return pOVar15;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18));
    Notes::iterator::operator++((iterator *)local_c8);
  } while( true );
}

Assistant:

Object *
Object::getDebug() const
{
    if (debugLoaded || context.options.noExtDebug)
        return debugObject.get();
    debugLoaded = true;

    // Use the build ID to find debug data.
    std::vector<unsigned char> buildID;
    for (const auto &note : notes()) {
        if (note.name() == "GNU" && note.type() == GNU_BUILD_ID) {
            std::ostringstream dir;
            dir << ".build-id/";
            size_t i;
            auto io = note.data();
            buildID.resize(io->size());
            io->readObj(0, &buildID[0], io->size());
            dir << std::hex << std::setw(2) << std::setfill('0') << int(buildID[0]);
            dir << "/";
            for (i = 1; i < size_t(io->size()); ++i)
                dir << std::setw(2) << int(buildID[i]);
            dir << ".debug" << std::dec;
            debugObject = context.getDebugImage(dir.str());
            break;
        }
    }

    // If that doesn't work, maybe the gnu_debuglink is valid?
    if (!debugObject) {
        // if we have a debug link, use that to attempt to find the debug file.
        auto &hdr = getSection(".gnu_debuglink", SHT_PROGBITS);
        if (hdr) {
            auto link = hdr.io()->readString(0);
            auto dir = context.dirname(stringify(*io));
            debugObject = context.getDebugImage(dir + "/" + link); //
        }
    }

#ifdef DEBUGINFOD
   if (!debugObject && buildID.size() && context.debuginfod) {
      char *path;
      int fd = debuginfod_find_debuginfo(
            context.debuginfod.get(),
            buildID.data(),
            int( buildID.size() ),
            &path );
      if (fd >= 0) {
         std::shared_ptr<Reader> reader = std::make_shared<FileReader>(context, path, fd );
         reader = std::make_shared<CacheReader>(reader);
         debugObject = std::make_shared<Elf::Object>( context, reader, true );
         free(path);
      } else if (context.verbose) {
         *context.debug << "failed to fetch debuginfo with debuginfod: " << strerror(-fd) << "\n";
      }
   }
#endif

    if (!debugObject) {
        if (context.verbose >= 2)
           *context.debug << "no debug object for " << *this->io << "\n";
        return nullptr;
    }

    if (context.verbose >= 2)
        *context.debug << "found debug object " << *debugObject->io << " for " << *io << "\n";

    // Validate that the .dynamic section in the debug object and the one in
    // the original image have the same .sh_addr.
    auto &s = getSection(".dynamic", SHT_NULL);
    auto &d = debugObject->getSection(".dynamic", SHT_NULL);

    if (d.shdr.sh_addr != s.shdr.sh_addr && context.debug) {
        Elf::Addr diff = s.shdr.sh_addr - d.shdr.sh_addr;
        IOFlagSave _(*context.debug);
        *context.debug << "warning: dynamic section for debug symbols "
           << *debugObject->io << " loaded for object "
           << *this->io << " at different offset: diff is "
           << std::hex << diff
           << ", assuming " << *this->io << " is prelinked" << std::dec << std::endl;

        // looks like the exe has been prelinked - adjust the debug info too.
        for (auto &sect : debugObject->sectionHeaders)
            sect->shdr.sh_addr += diff;

        for (auto &sectType : debugObject->programHeaders)
            for (auto &sect : sectType.second)
                sect.p_vaddr += diff;
    }
    return debugObject.get();
}